

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

ListReader * __thiscall
capnp::_::PointerReader::getList
          (ListReader *__return_storage_ptr__,PointerReader *this,ElementSize expectedElementSize,
          word *defaultValue)

{
  ushort uVar1;
  StructPointerCount SVar2;
  uint uVar3;
  word *pwVar4;
  Arena *pAVar5;
  ulong uVar6;
  char cVar7;
  int iVar8;
  WirePointer *pWVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar10;
  undefined7 in_register_00000011;
  ulong uVar11;
  char *pcVar12;
  WirePointer *pWVar13;
  uint uVar14;
  long lVar15;
  unsigned_short uVar16;
  int *piVar17;
  DebugComparison<int_&,_int> *this_00;
  ElementSize EVar18;
  uint uVar19;
  uint uVar20;
  int *piVar21;
  WirePointer *pWVar22;
  ulong uVar23;
  WirePointer *pWVar24;
  bool bVar25;
  Fault f;
  DebugComparison<int_&,_int> _kjCondition;
  Exception *local_80;
  WirePointer *local_78;
  uint local_70;
  int local_6c;
  Fault f_3;
  uint pointerCount;
  ListReader *local_58;
  ulong local_50;
  WirePointerCount expectedPointersPerElement;
  CapTableReader *local_40;
  BitCount expectedDataBitsPerElement;
  
  local_70 = (uint)CONCAT71(in_register_00000011,expectedElementSize);
  pWVar24 = (WirePointer *)&(anonymous_namespace)::zero;
  if (this->pointer != (WirePointer *)0x0) {
    pWVar24 = this->pointer;
  }
  local_80 = (Exception *)this->segment;
  local_6c = this->nestingLimit;
  pWVar13 = pWVar24 + 1;
  lVar15 = (long)((int)*(uint64_t *)&(pWVar24->offsetAndKind).value >> 2);
  if (local_80 == (Exception *)0x0) {
    pWVar9 = pWVar13 + lVar15;
  }
  else {
    pwVar4 = ((ArrayPtr<const_capnp::word> *)&(local_80->ownFile).content.disposer)->ptr;
    pWVar9 = (WirePointer *)(pwVar4 + (long)local_80->file);
    if (((long)pwVar4 - (long)pWVar13 >> 3 <= lVar15) &&
       (lVar15 <= (long)pWVar9 - (long)pWVar13 >> 3)) {
      pWVar9 = pWVar13 + lVar15;
    }
  }
  local_40 = this->capTable;
  pWVar13 = (WirePointer *)defaultValue;
  local_58 = __return_storage_ptr__;
  if ((pWVar24->field_1).upper32Bits != 0 || (int)*(uint64_t *)&(pWVar24->offsetAndKind).value != 0)
  goto LAB_00190934;
  do {
    while( true ) {
      if ((pWVar13 == (WirePointer *)0x0) ||
         (iVar8 = (int)*(uint64_t *)&(pWVar13->offsetAndKind).value,
         (pWVar13->field_1).upper32Bits == 0 && iVar8 == 0)) {
        local_58->ptr = (byte *)0x0;
        local_58->elementCount = 0;
        local_58->step = 0;
        local_58->segment = (SegmentReader *)0x0;
        local_58->capTable = (CapTableReader *)0x0;
        *(undefined8 *)((long)&local_58->step + 2) = 0;
        local_58->elementSize = (ElementSize)local_70;
        local_58->nestingLimit = 0x7fffffff;
        return local_58;
      }
      local_80 = (Exception *)0x0;
      pWVar9 = pWVar13 + (long)(iVar8 >> 2) + 1;
      defaultValue = (word *)0x0;
      pWVar24 = pWVar13;
LAB_00190934:
      _kjCondition.left = &local_6c;
      _kjCondition._8_8_ = (ulong)(uint)_kjCondition._12_4_ << 0x20;
      _kjCondition.op.content.ptr = " > ";
      _kjCondition.op.content.size_ = 4;
      _kjCondition.result = 0 < local_6c;
      pWVar13 = (WirePointer *)defaultValue;
      if (0 < local_6c) break;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<int&,int>&,char_const(&)[76]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x8e6,FAILED,"nestingLimit > 0",
                 "_kjCondition,\"Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.\""
                 ,&_kjCondition,
                 (char (*) [76])
                 "Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.");
      kj::_::Debug::Fault::~Fault(&f);
    }
    pWVar22 = pWVar24;
    if ((local_80 != (Exception *)0x0) && ((*(uint64_t *)&(pWVar24->offsetAndKind).value & 3) == 2))
    {
      pAVar5 = (Arena *)(local_80->ownFile).content.ptr;
      iVar8 = (*pAVar5->_vptr_Arena[2])(pAVar5,(ulong)(pWVar24->field_1).upper32Bits);
      local_80 = (Exception *)CONCAT44(extraout_var,iVar8);
      _kjCondition.left = (int *)&local_80;
      _kjCondition.right = 0;
      _kjCondition._12_4_ = 0;
      _kjCondition.op.content.ptr = " != ";
      _kjCondition.op.content.size_ = 5;
      _kjCondition.result = local_80 != (Exception *)0x0;
      if (_kjCondition.result) {
        uVar19 = (uint)*(uint64_t *)&(pWVar24->offsetAndKind).value;
        pcVar10 = (char *)(ulong)(uVar19 >> 3);
        pcVar12 = local_80->file;
        if ((long)pcVar12 < (long)pcVar10) {
          pcVar10 = pcVar12;
        }
        pWVar22 = (WirePointer *)
                  (((ArrayPtr<const_capnp::word> *)&(local_80->ownFile).content.disposer)->ptr +
                  (long)pcVar10);
        if (local_80 == (Exception *)0x0) {
          f.exception._0_1_ = 1;
LAB_001910ca:
          if ((*(uint64_t *)&(pWVar24->offsetAndKind).value & 4) == 0) {
            pWVar24 = pWVar22 + 1;
            lVar15 = (long)((int)*(uint64_t *)&(pWVar22->offsetAndKind).value >> 2);
            if (local_80 == (Exception *)0x0) {
              pWVar9 = pWVar24 + lVar15;
            }
            else {
              pwVar4 = ((ArrayPtr<const_capnp::word> *)&(local_80->ownFile).content.disposer)->ptr;
              pWVar9 = (WirePointer *)(pwVar4 + (long)local_80->file);
              if (((long)pwVar4 - (long)pWVar24 >> 3 <= lVar15) &&
                 (lVar15 <= (long)pWVar9 - (long)pWVar24 >> 3)) {
                pWVar9 = pWVar24 + lVar15;
              }
            }
            goto LAB_00190a78;
          }
          pWVar24 = pWVar22 + 1;
          pAVar5 = (Arena *)(local_80->ownFile).content.ptr;
          iVar8 = (*pAVar5->_vptr_Arena[2])(pAVar5,(ulong)(pWVar22->field_1).upper32Bits);
          f.exception = (Exception *)CONCAT44(extraout_var_00,iVar8);
          _kjCondition.left = (int *)&f;
          _kjCondition.right = 0;
          _kjCondition._12_4_ = 0;
          _kjCondition.op.content.ptr = " != ";
          _kjCondition.op.content.size_ = 5;
          _kjCondition.result = f.exception != (Exception *)0x0;
          if (f.exception == (Exception *)0x0) {
            this_00 = (DebugComparison<int_&,_int> *)&f_3;
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[56]>
                      ((Fault *)this_00,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x25f,FAILED,"newSegment != nullptr",
                       "_kjCondition,\"Message contains double-far pointer to unknown segment.\"",
                       (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&_kjCondition,
                       (char (*) [56])"Message contains double-far pointer to unknown segment.");
          }
          else {
            uVar19 = (uint)*(uint64_t *)&(pWVar22->offsetAndKind).value & 3;
            _kjCondition.left = (int *)CONCAT44(2,uVar19);
            _kjCondition._8_8_ = anon_var_dwarf_48f46;
            _kjCondition.op.content.ptr = (char *)0x5;
            _kjCondition.op.content.size_ = (size_t)(uVar19 == 2);
            if (uVar19 == 2) {
              pcVar12 = (char *)(ulong)((uint)*(uint64_t *)&(pWVar22->offsetAndKind).value >> 3);
              if ((long)(f.exception)->file < (long)pcVar12) {
                pcVar12 = (f.exception)->file;
              }
              pWVar9 = (WirePointer *)
                       (((ArrayPtr<const_capnp::word> *)&((f.exception)->ownFile).content.disposer)
                        ->ptr + (long)pcVar12);
              pWVar22 = pWVar24;
              local_80 = f.exception;
              goto LAB_00190a78;
            }
            this_00 = (DebugComparison<int_&,_int> *)&f_3;
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[51]>
                      ((Fault *)this_00,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x263,FAILED,"pad->kind() == WirePointer::FAR",
                       "_kjCondition,\"Second word of double-far pad must be far pointer.\"",
                       (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                       &_kjCondition,
                       (char (*) [51])"Second word of double-far pad must be far pointer.");
          }
        }
        else {
          uVar11 = 2 - (ulong)((uVar19 & 4) == 0);
          if (pcVar12 < pcVar10 + uVar11) {
            f.exception = (Exception *)((ulong)f.exception._1_7_ << 8);
          }
          else {
            uVar23 = (*(ReadLimiter **)&local_80->line)->limit;
            if (uVar23 < uVar11) {
              (*((Arena *)(local_80->ownFile).content.ptr)->_vptr_Arena[3])();
            }
            else {
              (*(ReadLimiter **)&local_80->line)->limit = uVar23 - uVar11;
            }
            f.exception._0_1_ = uVar11 <= uVar23;
            if (uVar11 <= uVar23) goto LAB_001910ca;
          }
          this_00 = &_kjCondition;
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[318]>
                    ((Fault *)this_00,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x24d,FAILED,"boundsCheck(segment, ptr, padWords)",
                     "_kjCondition,\"Message contains out-of-bounds far pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                     ,(DebugExpression<bool> *)&f,
                     (char (*) [318])
                     "Message contains out-of-bounds far pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                    );
        }
        kj::_::Debug::Fault::~Fault((Fault *)this_00);
        pWVar9 = (WirePointer *)0x0;
        pWVar22 = pWVar24;
      }
      else {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[49]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x244,FAILED,"segment != nullptr",
                   "_kjCondition,\"Message contains far pointer to unknown segment.\"",
                   (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&_kjCondition,
                   (char (*) [49])"Message contains far pointer to unknown segment.");
        kj::_::Debug::Fault::~Fault(&f);
        pWVar9 = (WirePointer *)0x0;
      }
    }
LAB_00190a78:
    cVar7 = (pWVar9 == (WirePointer *)0x0) * '\x02';
    if (pWVar9 != (WirePointer *)0x0) {
      uVar19 = (uint)*(uint64_t *)&(pWVar22->offsetAndKind).value & 3;
      _kjCondition.left = (int *)CONCAT44(1,uVar19);
      _kjCondition._8_8_ = anon_var_dwarf_48f46;
      _kjCondition.op.content.ptr = (char *)0x5;
      _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar19 == 1);
      local_78 = pWVar9;
      if (uVar19 == 1) {
        uVar19 = (pWVar22->field_1).upper32Bits;
        EVar18 = (ElementSize)uVar19 & INLINE_COMPOSITE;
        if (EVar18 == INLINE_COMPOSITE) {
          f_3.exception._0_4_ = uVar19 >> 3;
          bVar25 = true;
          if ((local_80 != (Exception *)0x0) &&
             (bVar25 = false,
             (char *)(((long)pWVar9 -
                       (long)((ArrayPtr<const_capnp::word> *)&(local_80->ownFile).content.disposer)
                             ->ptr >> 3) + (ulong)(StructDataBitCount)f_3.exception + 1) <=
             local_80->file)) {
            uVar23 = (ulong)(StructDataBitCount)f_3.exception + 1;
            uVar11 = (*(ReadLimiter **)&local_80->line)->limit;
            bVar25 = uVar11 >= uVar23;
            if (uVar11 < uVar23) {
              (*((Arena *)(local_80->ownFile).content.ptr)->_vptr_Arena[3])();
            }
            else {
              (*(ReadLimiter **)&local_80->line)->limit = uVar11 - uVar23;
            }
          }
          f.exception._0_1_ = bVar25;
          if (bVar25 == false) {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[319]>
                      ((Fault *)&_kjCondition,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x900,FAILED,"boundsCheck(segment, ptr, wordCount + POINTER_SIZE_IN_WORDS)",
                       "_kjCondition,\"Message contains out-of-bounds list pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                       ,(DebugExpression<bool> *)&f,
                       (char (*) [319])
                       "Message contains out-of-bounds list pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                      );
            kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition);
            cVar7 = '\x02';
          }
          else {
            pWVar24 = local_78 + 1;
            uVar19 = (uint)*(uint64_t *)&(local_78->offsetAndKind).value & 3;
            _kjCondition.left = (int *)(ulong)uVar19;
            _kjCondition._8_8_ = anon_var_dwarf_48f46;
            _kjCondition.op.content.ptr = (char *)0x5;
            _kjCondition.op.content.size_ =
                 CONCAT71(_kjCondition.op.content.size_._1_7_,uVar19 == 0);
            if (uVar19 == 0) {
              uVar19 = (uint)*(uint64_t *)&(local_78->offsetAndKind).value >> 2 & 0x1fffffff;
              uVar23 = (ulong)uVar19;
              uVar11 = (ulong)((uint)(local_78->field_1).structRef.ptrCount.value +
                              (uint)(local_78->field_1).structRef.dataSize.value);
              piVar21 = (int *)(uVar11 * uVar23);
              _kjCondition._8_8_ = &f_3;
              piVar17 = (int *)(ulong)(StructDataBitCount)f_3.exception;
              cVar7 = '\0';
              _kjCondition.op.content.ptr = " <= ";
              _kjCondition.op.content.size_ = 5;
              bVar25 = (long)piVar21 - (long)piVar17 == 0;
              _kjCondition.result = piVar21 < piVar17 || bVar25;
              _kjCondition.left = piVar21;
              if (piVar21 >= piVar17 && !bVar25) {
                local_50 = uVar11;
                kj::_::Debug::Fault::
                Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_int&>&,char_const(&)[57]>
                          (&f,
                           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                           ,0x90f,FAILED,
                           "upgradeBound<uint64_t>(size) * wordsPerElement <= wordCount",
                           "_kjCondition,\"INLINE_COMPOSITE list\'s elements overrun its word count.\""
                           ,(DebugComparison<unsigned_long,_unsigned_int_&> *)&_kjCondition,
                           (char (*) [57])
                           "INLINE_COMPOSITE list\'s elements overrun its word count.");
                kj::_::Debug::Fault::~Fault(&f);
                cVar7 = '\x02';
                uVar11 = local_50;
              }
              if (piVar21 < piVar17 || (long)piVar21 - (long)piVar17 == 0) {
                if ((int)uVar11 == 0) {
                  bVar25 = true;
                  if (local_80 != (Exception *)0x0) {
                    uVar6 = (*(ReadLimiter **)&local_80->line)->limit;
                    bVar25 = uVar6 >= uVar23;
                    if (uVar6 < uVar23) {
                      (*((Arena *)(local_80->ownFile).content.ptr)->_vptr_Arena[3])();
                    }
                    else {
                      (*(ReadLimiter **)&local_80->line)->limit = uVar6 - uVar23;
                    }
                  }
                  f.exception._0_1_ = bVar25;
                  if (bVar25 == false) {
                    kj::_::Debug::Fault::
                    Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[41]>
                              ((Fault *)&_kjCondition,
                               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                               ,0x917,FAILED,
                               "amplifiedRead(segment, size * (ONE * WORDS / ELEMENTS))",
                               "_kjCondition,\"Message contains amplified list pointer.\"",
                               (DebugExpression<bool> *)&f,
                               (char (*) [41])"Message contains amplified list pointer.");
                    kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition);
                    cVar7 = '\x02';
                    goto LAB_0019138d;
                  }
                }
                if ((local_70 & 0xff) - 2 < 4) {
                  uVar16 = (local_78->field_1).structRef.dataSize.value;
                  cVar7 = '\0';
                  _kjCondition.left = (int *)CONCAT62(_kjCondition.left._2_6_,uVar16);
                  _kjCondition.left = (int *)((ulong)_kjCondition.left & 0xffffffff);
                  _kjCondition._8_8_ = anon_var_dwarf_cf16;
                  _kjCondition.op.content.ptr = (char *)0x4;
                  _kjCondition.op.content.size_ =
                       CONCAT71(_kjCondition.op.content.size_._1_7_,uVar16 != 0);
                  if (uVar16 == 0) {
                    kj::_::Debug::Fault::
                    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_short,unsigned_int>&,char_const(&)[84]>
                              (&f,
                               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                               ,0x935,FAILED,"tag->structRef.dataSize.get() > ZERO * WORDS",
                               "_kjCondition,\"Schema mismatch: Expected a primitive list, but got a list of pointer-only \" \"structs.\""
                               ,(DebugComparison<unsigned_short,_unsigned_int> *)&_kjCondition,
                               (char (*) [84])
                               "Schema mismatch: Expected a primitive list, but got a list of pointer-only structs."
                              );
LAB_00190e33:
                    kj::_::Debug::Fault::~Fault(&f);
                    cVar7 = '\x02';
                  }
LAB_001914c6:
                  if (uVar16 == 0) goto LAB_0019138d;
                }
                else {
                  if ((local_70 & 0xff) == 6) {
                    uVar16 = (local_78->field_1).structRef.ptrCount.value;
                    cVar7 = '\0';
                    _kjCondition.left = (int *)CONCAT62(_kjCondition.left._2_6_,uVar16);
                    _kjCondition.left = (int *)((ulong)_kjCondition.left & 0xffffffff);
                    _kjCondition._8_8_ = anon_var_dwarf_cf16;
                    _kjCondition.op.content.ptr = (char *)0x4;
                    _kjCondition.op.content.size_ =
                         CONCAT71(_kjCondition.op.content.size_._1_7_,uVar16 != 0);
                    if (uVar16 == 0) {
                      kj::_::Debug::Fault::
                      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_short,unsigned_int>&,char_const(&)[79]>
                                (&f,
                                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                                 ,0x93d,FAILED,"tag->structRef.ptrCount.get() > ZERO * POINTERS",
                                 "_kjCondition,\"Schema mismatch: Expected a pointer list, but got a list of data-only \" \"structs.\""
                                 ,(DebugComparison<unsigned_short,_unsigned_int> *)&_kjCondition,
                                 (char (*) [79])
                                 "Schema mismatch: Expected a pointer list, but got a list of data-only structs."
                                );
                      goto LAB_00190e33;
                    }
                    goto LAB_001914c6;
                  }
                  if ((local_70 & 0xff) == 1) {
                    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[106]>
                              ((Fault *)&_kjCondition,
                               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                               ,0x92a,FAILED,(char *)0x0,
                               "\"Found struct list where bit list was expected; upgrading boolean lists to structs \" \"is no longer supported.\""
                               ,(char (*) [106])0x2274ab);
                    kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition);
                    cVar7 = '\x02';
                    goto LAB_0019138d;
                  }
                }
                uVar1 = (local_78->field_1).structRef.dataSize.value;
                SVar2 = (local_78->field_1).structRef.ptrCount.value;
                local_58->segment = (SegmentReader *)local_80;
                local_58->capTable = local_40;
                local_58->ptr = (byte *)pWVar24;
                local_58->elementCount = uVar19;
                local_58->step = (int)uVar11 << 6;
                local_58->structDataSize = (uint)uVar1 << 6;
                local_58->structPointerCount = SVar2;
                local_58->elementSize = INLINE_COMPOSITE;
                local_58->nestingLimit = local_6c + -1;
                cVar7 = '\x01';
              }
            }
            else {
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[61]>
                        (&f,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x907,FAILED,"tag->kind() == WirePointer::STRUCT",
                         "_kjCondition,\"INLINE_COMPOSITE lists of non-STRUCT type are not supported.\""
                         ,(DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind>
                           *)&_kjCondition,
                         (char (*) [61])
                         "INLINE_COMPOSITE lists of non-STRUCT type are not supported.");
              kj::_::Debug::Fault::~Fault(&f);
              cVar7 = '\x02';
            }
          }
        }
        else {
          f_3.exception._0_4_ = (&BITS_PER_ELEMENT_TABLE)[EVar18];
          pointerCount = (uint)(EVar18 == POINTER);
          uVar11 = (ulong)(uVar19 >> 3);
          uVar20 = pointerCount * 0x40 + (StructDataBitCount)f_3.exception;
          bVar25 = true;
          if (local_80 != (Exception *)0x0) {
            uVar23 = uVar20 * uVar11 + 0x3f >> 6 & 0xffffffff;
            bVar25 = false;
            if ((char *)(((long)pWVar9 -
                          (long)((ArrayPtr<const_capnp::word> *)
                                &(local_80->ownFile).content.disposer)->ptr >> 3) + uVar23) <=
                local_80->file) {
              uVar6 = (*(ReadLimiter **)&local_80->line)->limit;
              bVar25 = uVar6 >= uVar23;
              if (uVar6 < uVar23) {
                (*((Arena *)(local_80->ownFile).content.ptr)->_vptr_Arena[3])();
              }
              else {
                (*(ReadLimiter **)&local_80->line)->limit = uVar6 - uVar23;
              }
            }
          }
          f.exception._0_1_ = bVar25;
          if (bVar25 == false) {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[319]>
                      ((Fault *)&_kjCondition,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x958,FAILED,"boundsCheck(segment, ptr, wordCount)",
                       "_kjCondition,\"Message contains out-of-bounds list pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                       ,(DebugExpression<bool> *)&f,
                       (char (*) [319])
                       "Message contains out-of-bounds list pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                      );
            kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition);
            cVar7 = '\x02';
          }
          else {
            if ((uVar19 & 7) == 0) {
              bVar25 = true;
              if (local_80 != (Exception *)0x0) {
                uVar23 = (*(ReadLimiter **)&local_80->line)->limit;
                bVar25 = uVar23 >= uVar11;
                if (uVar23 < uVar11) {
                  (*((Arena *)(local_80->ownFile).content.ptr)->_vptr_Arena[3])();
                }
                else {
                  (*(ReadLimiter **)&local_80->line)->limit = uVar23 - uVar11;
                }
              }
              f.exception._0_1_ = bVar25;
              if (bVar25 == false) {
                kj::_::Debug::Fault::
                Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[41]>
                          ((Fault *)&_kjCondition,
                           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                           ,0x960,FAILED,
                           "amplifiedRead(segment, elementCount * (ONE * WORDS / ELEMENTS))",
                           "_kjCondition,\"Message contains amplified list pointer.\"",
                           (DebugExpression<bool> *)&f,
                           (char (*) [41])"Message contains amplified list pointer.");
                kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition);
                cVar7 = '\x02';
                goto LAB_0019138d;
              }
            }
            if (((char)local_70 == '\x01') || (EVar18 != BIT)) {
              uVar3 = (&BITS_PER_ELEMENT_TABLE)[local_70 & 0xff];
              _kjCondition.left = (int *)&expectedDataBitsPerElement;
              expectedPointersPerElement = (WirePointerCount)((char)local_70 == '\x06');
              _kjCondition._8_8_ = &f_3;
              cVar7 = '\0';
              _kjCondition.op.content.ptr = " <= ";
              _kjCondition.op.content.size_ = 5;
              _kjCondition.result = uVar3 <= (StructDataBitCount)f_3.exception;
              uVar14 = (StructDataBitCount)f_3.exception;
              expectedDataBitsPerElement = uVar3;
              if ((StructDataBitCount)f_3.exception < uVar3) {
                local_50 = CONCAT44(local_50._4_4_,(StructDataBitCount)f_3.exception);
                kj::_::Debug::Fault::
                Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_int&>&,char_const(&)[72]>
                          (&f,
                           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                           ,0x979,FAILED,"expectedDataBitsPerElement <= dataSize",
                           "_kjCondition,\"Schema mismatch: Message contained list with incompatible element type.\""
                           ,(DebugComparison<unsigned_int_&,_unsigned_int_&> *)&_kjCondition,
                           (char (*) [72])
                           "Schema mismatch: Message contained list with incompatible element type."
                          );
                kj::_::Debug::Fault::~Fault(&f);
                cVar7 = '\x02';
                uVar14 = (uint)local_50;
              }
              if (uVar3 <= uVar14) {
                _kjCondition.left = (int *)&expectedPointersPerElement;
                cVar7 = '\0';
                _kjCondition._8_8_ = &pointerCount;
                _kjCondition.op.content.ptr = " <= ";
                _kjCondition.op.content.size_ = 5;
                _kjCondition.result = expectedPointersPerElement <= pointerCount;
                if (pointerCount < expectedPointersPerElement) {
                  kj::_::Debug::Fault::
                  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_int&>&,char_const(&)[72]>
                            (&f,
                             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                             ,0x97d,FAILED,"expectedPointersPerElement <= pointerCount",
                             "_kjCondition,\"Schema mismatch: Message contained list with incompatible element type.\""
                             ,(DebugComparison<unsigned_int_&,_unsigned_int_&> *)&_kjCondition,
                             (char (*) [72])
                             "Schema mismatch: Message contained list with incompatible element type."
                            );
                  kj::_::Debug::Fault::~Fault(&f);
                  cVar7 = '\x02';
                }
              }
              if (cVar7 == '\0') {
                local_58->segment = (SegmentReader *)local_80;
                local_58->capTable = local_40;
                local_58->ptr = (byte *)local_78;
                local_58->elementCount = uVar19 >> 3;
                local_58->step = uVar20;
                local_58->structDataSize = (StructDataBitCount)f_3.exception;
                local_58->structPointerCount = (StructPointerCount)pointerCount;
                local_58->elementSize = EVar18;
                local_58->nestingLimit = local_6c + -1;
                cVar7 = '\x01';
              }
            }
            else {
              kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[106]>
                        ((Fault *)&_kjCondition,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x969,FAILED,(char *)0x0,
                         "\"Found bit list where struct list was expected; upgrading boolean lists to structs \" \"is no longer supported.\""
                         ,(char (*) [106])0x22795d);
              kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition);
              cVar7 = '\x02';
            }
          }
        }
      }
      else {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[84]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x8f3,FAILED,"ref->kind() == WirePointer::LIST",
                   "_kjCondition,\"Schema mismatch: Message contains non-list pointer where list pointer was \" \"expected.\""
                   ,(DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                    &_kjCondition,
                   (char (*) [84])
                   "Schema mismatch: Message contains non-list pointer where list pointer was expected."
                  );
        kj::_::Debug::Fault::~Fault(&f);
        cVar7 = '\x02';
      }
    }
LAB_0019138d:
    if (cVar7 != '\x02') {
      return local_58;
    }
  } while( true );
}

Assistant:

ListReader PointerReader::getList(ElementSize expectedElementSize, const word* defaultValue) const {
  const WirePointer* ref = pointer == nullptr ? &zero.pointer : pointer;
  return WireHelpers::readListPointer(
      segment, capTable, ref, defaultValue, expectedElementSize, nestingLimit);
}